

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest9::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest9 *this,_test_case *test_case)

{
  _test_case _Var1;
  allocator<char> local_22;
  undefined1 local_21;
  _test_case *local_20;
  _test_case *test_case_local;
  NegativeTest9 *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (NegativeTest9 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  _Var1 = *local_20;
  if (_Var1 == TEST_CASE_FIRST) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "TEST_CASE_INVALID_FLOAT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT");
  }
  else if (_Var1 == TEST_CASE_INVALID_INT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "TEST_CASE_INVALID_INT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT");
  }
  else if (_Var1 == TEST_CASE_INVALID_SUBROUTINE_UNIFORM_VALUE_COMPARISON) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "TEST_CASE_INVALID_SUBROUTINE_UNIFORM_VALUE_COMPARISON");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest9::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_FLOAT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT:
		result = "TEST_CASE_INVALID_FLOAT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT";
		break;
	case TEST_CASE_INVALID_INT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT:
		result = "TEST_CASE_INVALID_INT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT";
		break;
	case TEST_CASE_INVALID_SUBROUTINE_UNIFORM_VALUE_COMPARISON:
		result = "TEST_CASE_INVALID_SUBROUTINE_UNIFORM_VALUE_COMPARISON";
		break;
	default:
		break;
	}

	return result;
}